

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::DescriptorScalarReplacement::ReplaceCandidate
          (DescriptorScalarReplacement *this,Instruction *var)

{
  pointer ppIVar1;
  pointer ppIVar2;
  bool bVar3;
  bool bVar4;
  uint32_t id;
  DefUseManager *this_00;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  pointer ppIVar5;
  pointer ppIVar6;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> load_work_list
  ;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  access_chain_work_list;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  entry_point_work_list;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  access_chain_work_list.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  access_chain_work_list.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  access_chain_work_list.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  load_work_list.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  load_work_list.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  load_work_list.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  entry_point_work_list.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  entry_point_work_list.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  entry_point_work_list.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = Pass::get_def_use_mgr(&this->super_Pass);
  id = Instruction::result_id(var);
  local_50._8_8_ = 0;
  local_50._M_unused._M_object = ::operator_new(0x20);
  *(DescriptorScalarReplacement **)local_50._M_unused._0_8_ = this;
  *(vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> **)
   ((long)local_50._M_unused._0_8_ + 8) = &access_chain_work_list;
  *(vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> **)
   ((long)local_50._M_unused._0_8_ + 0x10) = &load_work_list;
  *(vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> **)
   ((long)local_50._M_unused._0_8_ + 0x18) = &entry_point_work_list;
  local_38 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/desc_sroa.cpp:62:25)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/desc_sroa.cpp:62:25)>
             ::_M_manager;
  bVar3 = analysis::DefUseManager::WhileEachUser
                    (this_00,id,(function<bool_(spvtools::opt::Instruction_*)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  ppIVar2 = access_chain_work_list.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppIVar6 = access_chain_work_list.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (bVar3) {
    do {
      ppIVar1 = load_work_list.
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppIVar5 = load_work_list.
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (ppIVar6 == ppIVar2) goto LAB_004dd78b;
      bVar3 = ReplaceAccessChain(this,var,*ppIVar6);
      ppIVar6 = ppIVar6 + 1;
    } while (bVar3);
  }
  goto LAB_004dd7a6;
  while( true ) {
    bVar4 = ReplaceEntryPoint(this,var,*ppIVar6);
    ppIVar6 = ppIVar6 + 1;
    if (!bVar4) break;
LAB_004dd7df:
    bVar3 = ppIVar6 == ppIVar2;
    if (bVar3) break;
  }
  goto LAB_004dd7a8;
  while( true ) {
    bVar3 = ReplaceLoadedValue(this,var,*ppIVar5);
    ppIVar5 = ppIVar5 + 1;
    if (!bVar3) break;
LAB_004dd78b:
    ppIVar2 = entry_point_work_list.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppIVar6 = entry_point_work_list.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ppIVar5 == ppIVar1) goto LAB_004dd7df;
  }
LAB_004dd7a6:
  bVar3 = false;
LAB_004dd7a8:
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&entry_point_work_list.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               );
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&load_work_list.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               );
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&access_chain_work_list.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               );
  return bVar3;
}

Assistant:

bool DescriptorScalarReplacement::ReplaceCandidate(Instruction* var) {
  std::vector<Instruction*> access_chain_work_list;
  std::vector<Instruction*> load_work_list;
  std::vector<Instruction*> entry_point_work_list;
  bool failed = !get_def_use_mgr()->WhileEachUser(
      var->result_id(), [this, &access_chain_work_list, &load_work_list,
                         &entry_point_work_list](Instruction* use) {
        if (use->opcode() == spv::Op::OpName) {
          return true;
        }

        if (use->IsDecoration()) {
          return true;
        }

        switch (use->opcode()) {
          case spv::Op::OpAccessChain:
          case spv::Op::OpInBoundsAccessChain:
            access_chain_work_list.push_back(use);
            return true;
          case spv::Op::OpLoad:
            load_work_list.push_back(use);
            return true;
          case spv::Op::OpEntryPoint:
            entry_point_work_list.push_back(use);
            return true;
          default:
            context()->EmitErrorMessage(
                "Variable cannot be replaced: invalid instruction", use);
            return false;
        }
        return true;
      });

  if (failed) {
    return false;
  }

  for (Instruction* use : access_chain_work_list) {
    if (!ReplaceAccessChain(var, use)) {
      return false;
    }
  }
  for (Instruction* use : load_work_list) {
    if (!ReplaceLoadedValue(var, use)) {
      return false;
    }
  }
  for (Instruction* use : entry_point_work_list) {
    if (!ReplaceEntryPoint(var, use)) {
      return false;
    }
  }
  return true;
}